

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_flags nk_edit_string_zero_terminated
                   (nk_context *ctx,nk_flags flags,char *buffer,int max,nk_plugin_filter filter)

{
  nk_flags nVar1;
  int iVar2;
  int iVar3;
  int len;
  int local_34;
  
  local_34 = nk_strlen(buffer);
  nVar1 = nk_edit_string(ctx,flags,buffer,&local_34,max,filter);
  iVar2 = 1;
  if (1 < max) {
    iVar2 = max;
  }
  iVar3 = iVar2 + -1;
  if (local_34 < iVar2) {
    iVar3 = local_34;
  }
  buffer[iVar3] = '\0';
  return nVar1;
}

Assistant:

NK_API nk_flags
nk_edit_string_zero_terminated(struct nk_context *ctx, nk_flags flags,
    char *buffer, int max, nk_plugin_filter filter)
{
    nk_flags result;
    int len = nk_strlen(buffer);
    result = nk_edit_string(ctx, flags, buffer, &len, max, filter);
    buffer[NK_MIN(NK_MAX(max-1,0), len)] = '\0';
    return result;
}